

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Path::makePath(Path *this,string *path,InArgs *in)

{
  char cVar1;
  pointer ppPVar2;
  void *pvVar3;
  char *pcVar4;
  ArrayIndex index;
  char *pcVar5;
  char *pcVar6;
  PathArgument local_78;
  string local_50;
  
  if (path->_M_string_length != 0) {
    pcVar5 = (path->_M_dataplus)._M_p;
    pcVar6 = pcVar5 + path->_M_string_length;
    ppPVar2 = (in->
              super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    do {
      cVar1 = *pcVar5;
      if (cVar1 == '%') {
        if ((ppPVar2 !=
             (in->
             super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
             )._M_impl.super__Vector_impl_data._M_finish) && ((*ppPVar2)->kind_ == kindKey)) {
          std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
                    (&this->args_,*ppPVar2);
        }
LAB_001472dd:
        pcVar4 = pcVar5 + 1;
      }
      else {
        if (cVar1 == '.') goto LAB_001472dd;
        pcVar4 = pcVar5;
        if (cVar1 == '[') {
          pcVar4 = pcVar5 + 1;
          if (pcVar5[1] == '%') {
            if ((ppPVar2 !=
                 (in->
                 super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish) && ((*ppPVar2)->kind_ == kindIndex)) {
              std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
                        (&this->args_,*ppPVar2);
            }
          }
          else {
            if (pcVar4 == pcVar6) {
              index = 0;
            }
            else {
              index = 0;
              do {
                if (9 < (byte)(*pcVar4 - 0x30U)) break;
                index = (uint)(byte)(*pcVar4 - 0x30U) + index * 10;
                pcVar4 = pcVar4 + 1;
              } while (pcVar4 != pcVar6);
            }
            PathArgument::PathArgument(&local_78,index);
            std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::
            emplace_back<Json::PathArgument>(&this->args_,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78.key_._M_dataplus._M_p != &local_78.key_.field_2) {
              operator_delete(local_78.key_._M_dataplus._M_p,
                              local_78.key_.field_2._M_allocated_capacity + 1);
            }
          }
          pcVar4 = pcVar4 + (pcVar4 != pcVar6);
        }
        else {
          while ((pcVar4 != pcVar6 && (pvVar3 = memchr("[.",(int)*pcVar4,3), pvVar3 == (void *)0x0))
                ) {
            pcVar4 = pcVar4 + 1;
          }
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar5,pcVar4);
          PathArgument::PathArgument(&local_78,&local_50);
          std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::
          emplace_back<Json::PathArgument>(&this->args_,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78.key_._M_dataplus._M_p != &local_78.key_.field_2) {
            operator_delete(local_78.key_._M_dataplus._M_p,
                            local_78.key_.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
      }
      pcVar5 = pcVar4;
    } while (pcVar4 != pcVar6);
  }
  return;
}

Assistant:

void 
Path::makePath( const std::string &path,
                const InArgs &in )
{
   const char *current = path.c_str();
   const char *end = current + path.length();
   InArgs::const_iterator itInArg = in.begin();
   while ( current != end )
   {
      if ( *current == '[' )
      {
         ++current;
         if ( *current == '%' )
            addPathInArg( path, in, itInArg, PathArgument::kindIndex );
         else
         {
            ArrayIndex index = 0;
            for ( ; current != end && *current >= '0'  &&  *current <= '9'; ++current )
               index = index * 10 + ArrayIndex(*current - '0');
            args_.push_back( index );
         }
         if ( current == end  ||  *current++ != ']' )
            invalidPath( path, int(current - path.c_str()) );
      }
      else if ( *current == '%' )
      {
         addPathInArg( path, in, itInArg, PathArgument::kindKey );
         ++current;
      }
      else if ( *current == '.' )
      {
         ++current;
      }
      else
      {
         const char *beginName = current;
         while ( current != end  &&  !strchr( "[.", *current ) )
            ++current;
         args_.push_back( std::string( beginName, current ) );
      }
   }
}